

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NextColumn(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumnsSet *pIVar3;
  ImGuiColumnsSet *pIVar4;
  ImGuiColumnData *pIVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if ((pIVar2->SkipItems == false) && ((pIVar2->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
    iVar1 = (pIVar2->DC).ItemWidthStack.Size;
    iVar7 = iVar1 + -1;
    (pIVar2->DC).ItemWidthStack.Size = iVar7;
    if (iVar7 == 0) {
      pfVar8 = &pIVar2->ItemWidthDefault;
    }
    else {
      pfVar8 = (pIVar2->DC).ItemWidthStack.Data + (long)iVar1 + -2;
    }
    (pIVar2->DC).ItemWidth = *pfVar8;
    PopClipRect();
    pIVar3 = (pIVar2->DC).ColumnsSet;
    fVar11 = (pIVar2->DC).CursorPos.y;
    uVar10 = -(uint)(fVar11 <= pIVar3->LineMaxY);
    pIVar3->LineMaxY = (float)(~uVar10 & (uint)fVar11 | (uint)pIVar3->LineMaxY & uVar10);
    iVar7 = pIVar3->Current;
    iVar1 = iVar7 + 1;
    pIVar3->Current = iVar1;
    if (iVar1 < pIVar3->Count) {
      pIVar4 = (GImGui->CurrentWindow->DC).ColumnsSet;
      iVar9 = iVar1;
      if (iVar7 < -1) {
        iVar9 = pIVar4->Current;
      }
      (pIVar2->DC).ColumnsOffset.x =
           (((pIVar4->MaxX - pIVar4->MinX) * (pIVar4->Columns).Data[iVar9].OffsetNorm + pIVar4->MinX
            ) - (pIVar2->DC).Indent.x) + (pIVar6->Style).ItemSpacing.x;
      ImDrawList::ChannelsSetCurrent(pIVar2->DrawList,iVar1);
      fVar11 = pIVar3->LineMinY;
    }
    else {
      (pIVar2->DC).ColumnsOffset.x = 0.0;
      ImDrawList::ChannelsSetCurrent(pIVar2->DrawList,0);
      pIVar3->Current = 0;
      fVar11 = pIVar3->LineMaxY;
      pIVar3->LineMinY = fVar11;
    }
    (pIVar2->DC).CursorPos.x =
         (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + (pIVar2->DC).ColumnsOffset.x);
    (pIVar2->DC).CursorPos.y = fVar11;
    (pIVar2->DC).CurrentLineSize.x = 0.0;
    (pIVar2->DC).CurrentLineSize.y = 0.0;
    (pIVar2->DC).CurrentLineTextBaseOffset = 0.0;
    pIVar3 = (GImGui->CurrentWindow->DC).ColumnsSet;
    iVar1 = pIVar3->Current;
    pIVar5 = (pIVar3->Columns).Data;
    PushClipRect(&pIVar5[iVar1].ClipRect.Min,&pIVar5[iVar1].ClipRect.Max,false);
    pIVar3 = (GImGui->CurrentWindow->DC).ColumnsSet;
    pIVar5 = (pIVar3->Columns).Data;
    PushItemWidth((pIVar3->MaxX - pIVar3->MinX) *
                  (pIVar5[(long)pIVar3->Current + 1].OffsetNorm - pIVar5[pIVar3->Current].OffsetNorm
                  ) * 0.65);
    return;
  }
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}